

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::FileDescriptor::CopyTo(FileDescriptor *this,FileDescriptorProto *proto)

{
  pointer pcVar1;
  Descriptor *pDVar2;
  EnumDescriptor *pEVar3;
  ServiceDescriptor *pSVar4;
  FieldDescriptor *pFVar5;
  FileDescriptor *pFVar6;
  void *pvVar7;
  DescriptorProto *proto_00;
  EnumDescriptorProto *proto_01;
  ServiceDescriptorProto *proto_02;
  FieldDescriptorProto *proto_03;
  long lVar8;
  long lVar9;
  int index;
  
  CopyHeadingTo(this,proto);
  if (0 < this->dependency_count_) {
    index = 0;
    do {
      pFVar6 = dependency(this,index);
      pcVar1 = (pFVar6->name_->_M_dataplus)._M_p;
      pvVar7 = internal::RepeatedPtrFieldBase::AddString
                         (&(proto->field_0)._impl_.dependency_.super_RepeatedPtrFieldBase);
      std::__cxx11::string::_M_replace((ulong)pvVar7,0,*(char **)((long)pvVar7 + 8),(ulong)pcVar1);
      index = index + 1;
    } while (index < this->dependency_count_);
  }
  if (0 < this->public_dependency_count_) {
    lVar8 = 0;
    do {
      RepeatedField<int>::Add
                (&(proto->field_0)._impl_.public_dependency_,this->public_dependencies_[lVar8]);
      lVar8 = lVar8 + 1;
    } while (lVar8 < this->public_dependency_count_);
  }
  if (0 < this->weak_dependency_count_) {
    lVar8 = 0;
    do {
      RepeatedField<int>::Add
                (&(proto->field_0)._impl_.weak_dependency_,this->weak_dependencies_[lVar8]);
      lVar8 = lVar8 + 1;
    } while (lVar8 < this->weak_dependency_count_);
  }
  if (0 < this->message_type_count_) {
    lVar9 = 0;
    lVar8 = 0;
    do {
      pDVar2 = this->message_types_;
      proto_00 = (DescriptorProto *)
                 internal::RepeatedPtrFieldBase::AddMessageLite
                           (&(proto->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase,
                            Arena::DefaultConstruct<google::protobuf::DescriptorProto>);
      Descriptor::CopyTo((Descriptor *)(&pDVar2->super_SymbolBase + lVar9),proto_00);
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0xa0;
    } while (lVar8 < this->message_type_count_);
  }
  if (0 < this->enum_type_count_) {
    lVar9 = 0;
    lVar8 = 0;
    do {
      pEVar3 = this->enum_types_;
      proto_01 = (EnumDescriptorProto *)
                 internal::RepeatedPtrFieldBase::AddMessageLite
                           (&(proto->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,
                            Arena::DefaultConstruct<google::protobuf::EnumDescriptorProto>);
      EnumDescriptor::CopyTo((EnumDescriptor *)(&pEVar3->super_SymbolBase + lVar9),proto_01);
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0x58;
    } while (lVar8 < this->enum_type_count_);
  }
  if (0 < this->service_count_) {
    lVar9 = 0;
    lVar8 = 0;
    do {
      pSVar4 = this->services_;
      proto_02 = (ServiceDescriptorProto *)
                 internal::RepeatedPtrFieldBase::AddMessageLite
                           (&(proto->field_0)._impl_.service_.super_RepeatedPtrFieldBase,
                            Arena::DefaultConstruct<google::protobuf::ServiceDescriptorProto>);
      ServiceDescriptor::CopyTo((ServiceDescriptor *)(&pSVar4->super_SymbolBase + lVar9),proto_02);
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0x40;
    } while (lVar8 < this->service_count_);
  }
  if (0 < this->extension_count_) {
    lVar9 = 0;
    lVar8 = 0;
    do {
      pFVar5 = this->extensions_;
      proto_03 = (FieldDescriptorProto *)
                 internal::RepeatedPtrFieldBase::AddMessageLite
                           (&(proto->field_0)._impl_.extension_.super_RepeatedPtrFieldBase,
                            Arena::DefaultConstruct<google::protobuf::FieldDescriptorProto>);
      FieldDescriptor::CopyTo((FieldDescriptor *)(&pFVar5->super_SymbolBase + lVar9),proto_03);
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0x58;
    } while (lVar8 < this->extension_count_);
  }
  return;
}

Assistant:

void FileDescriptor::CopyTo(FileDescriptorProto* proto) const {
  CopyHeadingTo(proto);

  for (int i = 0; i < dependency_count(); i++) {
    proto->add_dependency(dependency(i)->name());
  }

  for (int i = 0; i < public_dependency_count(); i++) {
    proto->add_public_dependency(public_dependencies_[i]);
  }

  for (int i = 0; i < weak_dependency_count(); i++) {
    proto->add_weak_dependency(weak_dependencies_[i]);
  }

  for (int i = 0; i < message_type_count(); i++) {
    message_type(i)->CopyTo(proto->add_message_type());
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->CopyTo(proto->add_enum_type());
  }
  for (int i = 0; i < service_count(); i++) {
    service(i)->CopyTo(proto->add_service());
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyTo(proto->add_extension());
  }
}